

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O2

BindingMap * __thiscall r_exec::BindingMap::get_atom_variable(BindingMap *this,Atom *a)

{
  atomic_int_fast64_t *paVar1;
  long *plVar2;
  char cVar3;
  AtomValue *this_00;
  undefined4 *in_RDX;
  ulong uVar4;
  ulong uVar5;
  undefined4 local_48;
  undefined4 local_44;
  P<r_exec::Value> local_40;
  Atom *local_38;
  
  local_38 = a + 0x10;
  uVar5 = 0;
  while( true ) {
    uVar4 = *(long *)(a + 0x18) - *(long *)(a + 0x10);
    if ((ulong)((long)uVar4 >> 3) <= uVar5) break;
    plVar2 = *(long **)(*(long *)(a + 0x10) + uVar5 * 8);
    local_44 = *in_RDX;
    cVar3 = (**(code **)(*plVar2 + 0x60))(plVar2,(Atom *)&local_44);
    r_code::Atom::~Atom((Atom *)&local_44);
    if (cVar3 != '\0') goto LAB_0016ea75;
    uVar5 = uVar5 + 1;
  }
  this_00 = (AtomValue *)operator_new(0x20);
  local_48 = *in_RDX;
  AtomValue::AtomValue(this_00,(BindingMap *)a,(Atom *)&local_48);
  LOCK();
  paVar1 = &(this_00->super_BoundValue).super_Value.super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_40.object = (_Object *)this_00;
  std::vector<core::P<r_exec::Value>,std::allocator<core::P<r_exec::Value>>>::
  emplace_back<core::P<r_exec::Value>>
            ((vector<core::P<r_exec::Value>,std::allocator<core::P<r_exec::Value>>> *)local_38,
             &local_40);
  uVar5 = uVar4 >> 3;
  core::P<r_exec::Value>::~P(&local_40);
  r_code::Atom::~Atom((Atom *)&local_48);
LAB_0016ea75:
  r_code::Atom::VLPointer((ushort)this,(ushort)uVar5);
  return this;
}

Assistant:

Atom BindingMap::get_atom_variable(Atom a)
{
    for (uint64_t i = 0; i < map.size(); ++i) {
        if (map[i]->contains(a)) {
            return Atom::VLPointer(i);
        }
    }

    uint64_t size = map.size();
    map.push_back(new AtomValue(this, a));
    return Atom::VLPointer(size);
}